

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<unsigned_int> __thiscall
kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>::
Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_> *this,
          ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser,ParserInput *input)

{
  bool bVar1;
  NullableValue<kj::_::Tuple<>_> *other;
  Tuple<> *pTVar2;
  int local_68;
  Maybe<kj::_::Tuple<>_> local_54;
  NullableValue<kj::_::Tuple<>_> local_52;
  undefined1 local_50 [6];
  NullableValue<kj::_::Tuple<>_> subResult;
  ParserInput subInput;
  uint count;
  ParserInput *input_local;
  ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser_local;
  
  subInput.begin._4_4_ = 0;
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      (&input->super_IteratorInput<char,_const_char_*>);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)local_50,input);
    ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>::operator()
              ((ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>> *)&local_54,
               (ParserInput *)subParser);
    other = kj::_::readMaybe<kj::_::Tuple<>>(&local_54);
    kj::_::NullableValue<kj::_::Tuple<>_>::NullableValue(&local_52,other);
    Maybe<kj::_::Tuple<>_>::~Maybe(&local_54);
    pTVar2 = kj::_::NullableValue::operator_cast_to_Tuple_((NullableValue *)&local_52);
    if (pTVar2 == (Tuple<> *)0x0) {
      local_68 = 3;
    }
    else {
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_50);
      subInput.begin._4_4_ = subInput.begin._4_4_ + 1;
      local_68 = 0;
    }
    kj::_::NullableValue<kj::_::Tuple<>_>::~NullableValue(&local_52);
    if (local_68 == 0) {
      local_68 = 0;
    }
    capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)local_50);
  } while (local_68 == 0);
  Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(uint *)((long)&subInput.begin + 4));
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }